

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakCallback.h
# Opt level: O0

void __thiscall
sznet::WeakCallback<sznet::net::TcpConnection>::operator()
          (WeakCallback<sznet::net::TcpConnection> *this)

{
  bool bVar1;
  element_type *__args;
  undefined1 local_20 [8];
  shared_ptr<sznet::net::TcpConnection> ptr;
  WeakCallback<sznet::net::TcpConnection> *this_local;
  
  ptr.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::weak_ptr<sznet::net::TcpConnection>::lock((weak_ptr<sznet::net::TcpConnection> *)local_20);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_20);
  if (bVar1) {
    __args = std::__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)
                        local_20);
    std::function<void_(sznet::net::TcpConnection_*)>::operator()(&this->m_function,__args);
  }
  std::shared_ptr<sznet::net::TcpConnection>::~shared_ptr
            ((shared_ptr<sznet::net::TcpConnection> *)local_20);
  return;
}

Assistant:

void operator()(ARGS&&... args) const
	{
		// �����Ƿ�����
		std::shared_ptr<CLASS> ptr(m_object.lock());
		if (ptr)
		{
			// û�п����͵��ûص�����
			m_function(ptr.get(), std::forward<ARGS>(args)...);
		}
		// else
		// {
		//   LOG_TRACE << "expired";
		// }
	}